

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer-CH.cc
# Opt level: O0

void __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,Model *model)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  LookupParameters *pLVar1;
  Parameters *pPVar2;
  Model *in_RSI;
  undefined8 *in_RDI;
  Dim *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  undefined4 uVar3;
  float in_stack_fffffffffffff95c;
  undefined4 uVar4;
  Model *in_stack_fffffffffffff960;
  Model *this_00;
  undefined8 in_stack_fffffffffffff968;
  uint n;
  Model *in_stack_fffffffffffff970;
  uint local_530;
  uint local_52c;
  uint *local_528;
  undefined8 local_520;
  uint local_4f4;
  uint *local_4f0;
  undefined8 local_4e8;
  uint local_4b8;
  uint local_4b4;
  uint *local_4b0;
  undefined8 local_4a8;
  undefined4 local_478;
  uint local_474;
  undefined4 *local_470;
  undefined8 local_468;
  uint local_438;
  uint local_434;
  uint *local_430;
  undefined8 local_428;
  uint local_3f8;
  int local_3f4;
  uint *local_3f0;
  undefined8 local_3e8;
  uint local_3b8;
  uint local_3b4;
  uint *local_3b0;
  undefined8 local_3a8;
  uint local_37c;
  uint *local_378;
  undefined8 local_370;
  uint local_340;
  uint local_33c;
  uint *local_338;
  undefined8 local_330;
  uint local_300;
  uint local_2fc;
  uint *local_2f8;
  undefined8 local_2f0;
  uint local_2c4;
  uint *local_2c0;
  undefined8 local_2b8;
  uint local_288;
  int local_284;
  uint *local_280;
  undefined8 local_278;
  uint local_24c;
  uint *local_248;
  undefined8 local_240;
  Model *in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdd4;
  uint in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffddc;
  FastLSTMBuilder *in_stack_fffffffffffffde0;
  uint local_214;
  uint *local_210;
  undefined8 local_208;
  uint local_1dc;
  uint *local_1d8;
  undefined8 local_1d0;
  uint local_1a4;
  uint *local_1a0;
  undefined8 local_198;
  uint local_16c;
  uint *local_168;
  undefined8 local_160;
  uint local_134;
  uint *local_130;
  undefined8 local_128;
  uint local_fc;
  uint *local_f8;
  undefined8 local_f0;
  uint local_c4;
  uint *local_c0;
  undefined8 local_b8;
  uint local_8c;
  uint *local_88;
  undefined8 local_80;
  uint local_54;
  uint *local_50;
  undefined8 local_48;
  Model *local_10;
  
  n = (uint)((ulong)in_stack_fffffffffffff968 >> 0x20);
  local_10 = in_RSI;
  cnn::FastLSTMBuilder::FastLSTMBuilder
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
  cnn::FastLSTMBuilder::FastLSTMBuilder
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
  cnn::FastLSTMBuilder::FastLSTMBuilder
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
  local_54 = WORD_DIM;
  local_50 = &local_54;
  local_48 = 1;
  x._M_array._4_4_ = in_stack_fffffffffffff95c;
  x._M_array._0_4_ = in_stack_fffffffffffff958;
  x._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x);
  pLVar1 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff970,n,(Dim *)in_stack_fffffffffffff960,
                      in_stack_fffffffffffff95c);
  *in_RDI = pLVar1;
  local_8c = CHAR_DIM;
  local_88 = &local_8c;
  local_80 = 1;
  x_00._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_00._M_array._0_4_ = in_stack_fffffffffffff958;
  x_00._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_00);
  pLVar1 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff970,n,(Dim *)in_stack_fffffffffffff960,
                      in_stack_fffffffffffff95c);
  in_RDI[1] = pLVar1;
  local_c4 = INPUT_DIM;
  local_c0 = &local_c4;
  local_b8 = 1;
  x_01._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_01._M_array._0_4_ = in_stack_fffffffffffff958;
  x_01._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_01);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[2] = pPVar2;
  local_fc = INPUT_DIM;
  local_f8 = &local_fc;
  local_f0 = 1;
  x_02._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_02._M_array._0_4_ = in_stack_fffffffffffff958;
  x_02._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_02);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[3] = pPVar2;
  local_134 = INPUT_DIM;
  local_130 = &local_134;
  local_128 = 1;
  x_03._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_03._M_array._0_4_ = in_stack_fffffffffffff958;
  x_03._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_03);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[5] = pPVar2;
  local_16c = INPUT_DIM;
  local_168 = &local_16c;
  local_160 = 1;
  x_04._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_04._M_array._0_4_ = in_stack_fffffffffffff958;
  x_04._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_04);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[4] = pPVar2;
  local_1a4 = CHAR_DIM;
  local_1a0 = &local_1a4;
  local_198 = 1;
  x_05._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_05._M_array._0_4_ = in_stack_fffffffffffff958;
  x_05._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_05);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[6] = pPVar2;
  local_1dc = CHAR_DIM;
  local_1d8 = &local_1dc;
  local_1d0 = 1;
  x_06._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_06._M_array._0_4_ = in_stack_fffffffffffff958;
  x_06._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_06);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[7] = pPVar2;
  local_214 = CHAR_DIM;
  local_210 = &local_214;
  local_208 = 1;
  x_07._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_07._M_array._0_4_ = in_stack_fffffffffffff958;
  x_07._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_07);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[9] = pPVar2;
  local_24c = CHAR_DIM;
  local_248 = &local_24c;
  local_240 = 1;
  x_08._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_08._M_array._0_4_ = in_stack_fffffffffffff958;
  x_08._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_08);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[8] = pPVar2;
  local_288 = CHAR_HIDDEN_DIM;
  local_284 = CHAR_DIM * (CHAR_WINDOWS * 2 + 1);
  local_280 = &local_288;
  local_278 = 2;
  x_09._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_09._M_array._0_4_ = in_stack_fffffffffffff958;
  x_09._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_09);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[10] = pPVar2;
  local_2c4 = CHAR_HIDDEN_DIM;
  local_2c0 = &local_2c4;
  local_2b8 = 1;
  x_10._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_10._M_array._0_4_ = in_stack_fffffffffffff958;
  x_10._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_10);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[0xb] = pPVar2;
  local_300 = CHAR_HIDDEN_DIM;
  local_2fc = CHAR_HIDDEN_DIM;
  local_2f8 = &local_300;
  local_2f0 = 2;
  x_11._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_11._M_array._0_4_ = in_stack_fffffffffffff958;
  x_11._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_11);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[0xc] = pPVar2;
  local_340 = CHAR_HIDDEN_DIM;
  local_33c = WORD_DIM;
  local_338 = &local_340;
  local_330 = 2;
  x_12._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_12._M_array._0_4_ = in_stack_fffffffffffff958;
  x_12._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_12);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[0xd] = pPVar2;
  local_37c = CHAR_HIDDEN_DIM;
  local_378 = &local_37c;
  local_370 = 1;
  x_13._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_13._M_array._0_4_ = in_stack_fffffffffffff958;
  x_13._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_13);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[0xe] = pPVar2;
  local_3b8 = CHAR_HIDDEN_DIM;
  local_3b4 = CHAR_HIDDEN_DIM;
  local_3b0 = &local_3b8;
  local_3a8 = 2;
  x_14._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_14._M_array._0_4_ = in_stack_fffffffffffff958;
  x_14._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_14);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[0xf] = pPVar2;
  local_3f8 = HIDDEN_DIM;
  local_3f4 = HIDDEN_DIM * 2;
  local_3f0 = &local_3f8;
  local_3e8 = 2;
  x_15._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_15._M_array._0_4_ = in_stack_fffffffffffff958;
  x_15._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_15);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[0x10] = pPVar2;
  local_438 = HIDDEN_DIM;
  local_434 = HIDDEN_DIM;
  local_430 = &local_438;
  local_428 = 2;
  x_16._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_16._M_array._0_4_ = in_stack_fffffffffffff958;
  x_16._M_len = (size_type)in_stack_fffffffffffff960;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_16);
  pPVar2 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff960,
                      (Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  in_RDI[0x11] = pPVar2;
  local_478 = 1;
  local_474 = HIDDEN_DIM;
  local_470 = &local_478;
  local_468 = 2;
  x_17._M_array._4_4_ = in_stack_fffffffffffff95c;
  x_17._M_array._0_4_ = in_stack_fffffffffffff958;
  x_17._M_len = (size_type)local_10;
  this_00 = local_10;
  cnn::Dim::Dim(in_stack_fffffffffffff950,x_17);
  pPVar2 = cnn::Model::add_parameters
                     (this_00,(Dim *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      (float)((ulong)in_stack_fffffffffffff950 >> 0x20));
  uVar3 = SUB84(pPVar2,0);
  uVar4 = (undefined4)((ulong)pPVar2 >> 0x20);
  in_RDI[0x12] = pPVar2;
  local_4b8 = LABEL_HIDDEN_DIM;
  local_4b4 = HIDDEN_DIM;
  local_4b0 = &local_4b8;
  local_4a8 = 2;
  x_18._M_len = (size_type)this_00;
  x_18._M_array = (iterator)pPVar2;
  cnn::Dim::Dim((Dim *)local_10,x_18);
  pPVar2 = cnn::Model::add_parameters
                     (this_00,(Dim *)CONCAT44(uVar4,uVar3),(float)((ulong)local_10 >> 0x20));
  in_RDI[0x13] = pPVar2;
  local_4f4 = LABEL_HIDDEN_DIM;
  local_4f0 = &local_4f4;
  local_4e8 = 1;
  x_19._M_array._4_4_ = uVar4;
  x_19._M_array._0_4_ = uVar3;
  x_19._M_len = (size_type)this_00;
  cnn::Dim::Dim((Dim *)local_10,x_19);
  pPVar2 = cnn::Model::add_parameters
                     (this_00,(Dim *)CONCAT44(uVar4,uVar3),(float)((ulong)local_10 >> 0x20));
  in_RDI[0x14] = pPVar2;
  local_530 = LABEL_SIZE;
  local_52c = LABEL_HIDDEN_DIM;
  local_528 = &local_530;
  local_520 = 2;
  x_20._M_array._4_4_ = uVar4;
  x_20._M_array._0_4_ = uVar3;
  x_20._M_len = (size_type)this_00;
  cnn::Dim::Dim((Dim *)local_10,x_20);
  pPVar2 = cnn::Model::add_parameters
                     (this_00,(Dim *)CONCAT44(uVar4,uVar3),(float)((ulong)local_10 >> 0x20));
  in_RDI[0x15] = pPVar2;
  return;
}

Assistant:

explicit RNNLanguageModel(Model& model) :
      l2rbuilder(LAYERS+1, INPUT_WINDOWS_DIM, HIDDEN_DIM, &model),
      r2lbuilder(LAYERS+1, INPUT_WINDOWS_DIM, HIDDEN_DIM, &model),
      orderbuilder(LAYERS, HIDDEN_DIM*4, HIDDEN_DIM, &model){

    p_w = model.add_lookup_parameters(VOCAB_SIZE, {WORD_DIM}); 
    p_c = model.add_lookup_parameters(CHAR_SIZE, {CHAR_DIM});
    
    p_wordpadding_2 = model.add_parameters({INPUT_DIM});
    p_wordpadding_1 = model.add_parameters({INPUT_DIM});
    p_wordpadding2 = model.add_parameters({INPUT_DIM});
    p_wordpadding1 = model.add_parameters({INPUT_DIM});

    p_charpadding_2 = model.add_parameters({CHAR_DIM});
    p_charpadding_1 = model.add_parameters({CHAR_DIM});
    p_charpadding2 = model.add_parameters({CHAR_DIM});
    p_charpadding1 = model.add_parameters({CHAR_DIM});

    p_charw2charh = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_DIM*(CHAR_WINDOWS*2+1)});
    p_charhbias = model.add_parameters({CHAR_HIDDEN_DIM});

    //attention pooling
    p_charh2xMExp = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_HIDDEN_DIM});
    p_word2xMExp = model.add_parameters({CHAR_HIDDEN_DIM, WORD_DIM});
    p_xMExpbias = model.add_parameters({CHAR_HIDDEN_DIM});
    p_xMExp2xExp = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_HIDDEN_DIM});
    //

    // p_l2oh = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    // p_r2oh = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    // p_ohbias = model.add_parameters({HIDDEN_DIM});

    //attention labelling
    p_oh2ohxMExp = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM*2});
    p_osh2ohxMExp = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    p_u = model.add_parameters({1,HIDDEN_DIM});

    p_oh2lh = model.add_parameters({LABEL_HIDDEN_DIM,HIDDEN_DIM});
    p_lhbias = model.add_parameters({LABEL_HIDDEN_DIM});

    p_lh2l = model.add_parameters({LABEL_SIZE, LABEL_HIDDEN_DIM});
  }